

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.cpp
# Opt level: O2

Document * getMessage(void)

{
  size_t sVar1;
  ostream *poVar2;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDI;
  bool bVar3;
  string buffer;
  Document json;
  Ch *local_a0;
  undefined8 local_98;
  Ch local_90 [16];
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_80;
  
  sVar1 = readHeaders();
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = '\0';
  while (bVar3 = sVar1 != 0, sVar1 = sVar1 - 1, bVar3) {
    getchar();
    std::__cxx11::string::push_back((char)&local_a0);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&local_80,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::Parse<0u,rapidjson::UTF8<char>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&local_80,local_a0);
  if (local_80.parseResult_.code_ == kParseErrorNone) {
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(in_RDI,&local_80);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"!!!Error parsing JSON\n");
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_a0);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error code: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_80.parseResult_.code_);
    std::operator<<(poVar2,"\n");
    sendError((Id *)0x0,ParseError,"Failed to parse JSON",(Value *)0x0);
    getMessage();
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return in_RDI;
}

Assistant:

Document getMessage () {
    size_t length = readHeaders();

    string buffer;

    for (size_t i = 0; i < length; i++) {
        char c = static_cast<char>(getchar());
        buffer += c;
    }

//    std::cerr << "INCOMING\n";
//    std::cerr << buffer << "\n\n";

    Document json;
    json.Parse(buffer);

    if (json.HasParseError()) {
        std::cerr << "!!!Error parsing JSON\n";
        std::cerr << buffer << "\n";

        auto error = json.GetParseError();
        std::cerr << "Error code: " << error << "\n";

        sendError(nullptr, ResponseHandler::ErrorCode::ParseError, "Failed to parse JSON");

        return getMessage();
    }

    return json;
}